

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O3

int undead_to_corpse(int mndx)

{
  switch(mndx) {
  case 0xe8:
  case 0xe9:
  case 0xfa:
switchD_001e5d33_caseD_e8:
    return 0x10b;
  case 0xea:
  case 0xeb:
  case 0xec:
  case 0xed:
  case 0xee:
  case 0xef:
  case 0xf0:
  case 0xf1:
  case 0xf2:
  case 0xf3:
  case 0xf4:
switchD_001e5d33_caseD_ea:
    return mndx;
  case 0xf5:
switchD_001e5d33_caseD_ea:
    return 0x3c;
  case 0xf6:
switchD_001e5d33_caseD_f6:
    return 0xaa;
  case 0xf7:
switchD_001e5d33_caseD_f7:
    return 0x4a;
  case 0xf8:
switchD_001e5d33_caseD_f8:
    return 0x2d;
  case 0xf9:
switchD_001e5d33_caseD_f9:
    return 0x111;
  case 0xfb:
switchD_001e5d33_caseD_fb:
    return 0xb4;
  case 0xfc:
switchD_001e5d33_caseD_fc:
    return 0xae;
  default:
    switch(mndx) {
    case 0xc1:
      goto switchD_001e5d33_caseD_ea;
    case 0xc2:
      goto switchD_001e5d33_caseD_f6;
    case 0xc3:
      goto switchD_001e5d33_caseD_f7;
    case 0xc4:
      goto switchD_001e5d33_caseD_f8;
    case 0xc5:
      goto switchD_001e5d33_caseD_f9;
    case 0xc6:
      goto switchD_001e5d33_caseD_e8;
    case 199:
      goto switchD_001e5d33_caseD_fb;
    case 200:
      goto switchD_001e5d33_caseD_fc;
    default:
      goto switchD_001e5d33_caseD_ea;
    }
  }
}

Assistant:

int undead_to_corpse(int mndx)
{
	switch (mndx) {
	case PM_KOBOLD_ZOMBIE:
	case PM_KOBOLD_MUMMY:	mndx = PM_KOBOLD;  break;
	case PM_DWARF_ZOMBIE:
	case PM_DWARF_MUMMY:	mndx = PM_DWARF;  break;
	case PM_GNOME_ZOMBIE:
	case PM_GNOME_MUMMY:	mndx = PM_GNOME;  break;
	case PM_ORC_ZOMBIE:
	case PM_ORC_MUMMY:	mndx = PM_ORC;  break;
	case PM_ELF_ZOMBIE:
	case PM_ELF_MUMMY:	mndx = PM_ELF;  break;
	case PM_VAMPIRE:
	case PM_VAMPIRE_LORD:
	case PM_HUMAN_ZOMBIE:
	case PM_HUMAN_MUMMY:	mndx = PM_HUMAN;  break;
	case PM_GIANT_ZOMBIE:
	case PM_GIANT_MUMMY:	mndx = PM_GIANT;  break;
	case PM_ETTIN_ZOMBIE:
	case PM_ETTIN_MUMMY:	mndx = PM_ETTIN;  break;
	default:  break;
	}
	return mndx;
}